

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

RowGroupPointer *
duckdb::RowGroup::Deserialize(RowGroupPointer *__return_storage_ptr__,Deserializer *deserializer)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<duckdb::MetaBlockPointer,_true> local_38;
  
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"row_start");
  iVar1 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  __return_storage_ptr__->row_start = CONCAT44(extraout_var,iVar1);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"tuple_count");
  iVar1 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  __return_storage_ptr__->tuple_count = CONCAT44(extraout_var_00,iVar1);
  Deserializer::ReadProperty<duckdb::vector<duckdb::MetaBlockPointer,true>>
            (&local_38,deserializer,0x66,"data_pointers");
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  Deserializer::ReadProperty<duckdb::vector<duckdb::MetaBlockPointer,true>>
            (&local_38,deserializer,0x67,"delete_pointers");
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

RowGroupPointer RowGroup::Deserialize(Deserializer &deserializer) {
	RowGroupPointer result;
	result.row_start = deserializer.ReadProperty<uint64_t>(100, "row_start");
	result.tuple_count = deserializer.ReadProperty<uint64_t>(101, "tuple_count");
	result.data_pointers = deserializer.ReadProperty<vector<MetaBlockPointer>>(102, "data_pointers");
	result.deletes_pointers = deserializer.ReadProperty<vector<MetaBlockPointer>>(103, "delete_pointers");
	return result;
}